

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseNoFrames(TidyDocImpl *doc,Node *noframes,GetTokenMode mode)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Lexer *pLVar3;
  Dict *pDVar4;
  TidyParserMemory data;
  Bool BVar5;
  long lVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node **ppNVar9;
  int iVar10;
  Node *pNVar11;
  bool bVar12;
  undefined8 uStack_50;
  long lStack_48;
  
  if (noframes == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar6 = (long)iVar1;
    if (-1 < lVar6) {
      pTVar2 = (doc->stack).content;
      noframes = pTVar2[lVar6].original_node;
      pNVar11 = pTVar2[lVar6].reentry_node;
      iVar10 = pTVar2[lVar6].reentry_state;
      bVar12 = pTVar2[lVar6].register_1 == 0;
      (doc->stack).top = iVar1 + -1;
      goto LAB_0013df99;
    }
    noframes = (Node *)0x0;
  }
  else if ((doc->config).value[1].v == 0) {
    *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x20;
  }
  bVar12 = true;
  pNVar11 = (Node *)0x0;
  iVar10 = 0;
LAB_0013df99:
  pLVar3 = doc->lexer;
LAB_0013dfa2:
  do {
    do {
      while (iVar10 == 1) {
        iVar10 = 0;
        if ((!bVar12) && (pNVar7 = prvTidyFindBody(doc), pNVar7 != pNVar11)) {
          prvTidyCoerceNode(doc,pNVar11,TidyTag_DIV,no,no);
          pNVar7 = prvTidyFindBody(doc);
          iVar10 = 0;
          if (pNVar7 != (Node *)0x0) {
            prvTidyRemoveNode(pNVar11);
            pNVar11->parent = pNVar7;
            pNVar8 = pNVar7->last;
            pNVar11->prev = pNVar8;
            ppNVar9 = &pNVar7->content;
            if (pNVar8 != (Node *)0x0) {
              ppNVar9 = &pNVar8->next;
            }
            *ppNVar9 = pNVar11;
            pNVar7->last = pNVar11;
            iVar10 = 0;
          }
        }
      }
      if (iVar10 == 2) {
        prvTidyReport(doc,noframes,pNVar11,0x25a);
        return (Node *)0x0;
      }
    } while (iVar10 != 0);
    pNVar7 = prvTidyGetToken(doc,IgnoreWhitespace);
    iVar10 = 2;
    pNVar11 = (Node *)0x0;
  } while (pNVar7 == (Node *)0x0);
  pDVar4 = pNVar7->tag;
  if ((pDVar4 == noframes->tag) && (pNVar7->type == EndTag)) {
    prvTidyFreeNode(doc,pNVar7);
    noframes->closed = yes;
    TrimSpaces(doc,noframes);
    return (Node *)0x0;
  }
  pNVar11 = pNVar7;
  if (pDVar4 == (Dict *)0x0) goto LAB_0013e077;
  if (pDVar4->id != TidyTag_HTML) {
    if (pDVar4->id - TidyTag_FRAME < 2) {
      TrimSpaces(doc,noframes);
      if (pNVar7->type == EndTag) {
        prvTidyReport(doc,noframes,pNVar7,0x235);
        prvTidyFreeNode(doc,pNVar7);
        return (Node *)0x0;
      }
      prvTidyReport(doc,noframes,pNVar7,0x259);
      prvTidyUngetToken(doc);
      return (Node *)0x0;
    }
    goto LAB_0013e077;
  }
  BVar5 = prvTidynodeIsElement(pNVar7);
  if (BVar5 != no) goto LAB_0013e0df;
  goto LAB_0013e0f4;
LAB_0013e077:
  BVar5 = InsertMisc(noframes,pNVar7);
  iVar10 = 0;
  if (BVar5 != no) goto LAB_0013dfa2;
  if (((pNVar7->tag == (Dict *)0x0) || (pNVar7->tag->id != TidyTag_BODY)) ||
     (pNVar7->type != StartTag)) {
    BVar5 = prvTidynodeIsText(pNVar7);
    if ((BVar5 == no) && ((pNVar7->tag == (Dict *)0x0 || (pNVar7->type == EndTag)))) {
LAB_0013e0df:
      prvTidyReport(doc,noframes,pNVar7,0x235);
LAB_0013e0f4:
      prvTidyFreeNode(doc,pNVar7);
      iVar10 = 0;
      goto LAB_0013dfa2;
    }
    pNVar8 = prvTidyFindBody(doc);
    if (pNVar8 == (Node *)0x0) {
      if (pLVar3->seenEndBody != no) goto LAB_0013e0df;
      prvTidyUngetToken(doc);
      pNVar7 = prvTidyInferredTag(doc,TidyTag_BODY);
      if (*(int *)((doc->config).value + 100) != 0) {
        prvTidyReport(doc,noframes,pNVar7,0x247);
      }
      pNVar7->parent = noframes;
      pNVar8 = noframes;
    }
    else {
      BVar5 = prvTidynodeIsText(pNVar7);
      if (BVar5 != no) {
        prvTidyUngetToken(doc);
        pNVar7 = prvTidyInferredTag(doc,TidyTag_P);
        prvTidyReport(doc,noframes,pNVar7,0x233);
      }
      pNVar7->parent = pNVar8;
    }
    pNVar11 = pNVar8->last;
    pNVar7->prev = pNVar11;
    ppNVar9 = &pNVar11->next;
    if (pNVar11 == (Node *)0x0) {
      ppNVar9 = &pNVar8->content;
    }
    *ppNVar9 = pNVar7;
    pNVar8->last = pNVar7;
    lStack_48 = 0;
    uStack_50 = 0;
  }
  else {
    uStack_50 = 0x100000000;
    lStack_48 = (ulong)pLVar3->seenEndBody << 0x20;
    pNVar7->parent = noframes;
    pNVar11 = noframes->last;
    pNVar7->prev = pNVar11;
    ppNVar9 = &pNVar11->next;
    if (pNVar11 == (Node *)0x0) {
      ppNVar9 = &noframes->content;
    }
    *ppNVar9 = pNVar7;
    noframes->last = pNVar7;
  }
  data.original_node = noframes;
  data.identity = prvTidyParseNoFrames;
  data.reentry_node = pNVar7;
  data.reentry_mode = (undefined4)uStack_50;
  data.reentry_state = uStack_50._4_4_;
  data.mode = (undefined4)lStack_48;
  data.register_1 = lStack_48._4_4_;
  data._40_8_ = 0;
  prvTidypushMemory(doc,data);
  return pNVar7;
}

Assistant:

Node* TY_(ParseNoFrames)( TidyDocImpl* doc, Node *noframes, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool body_seen = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISBODY,        /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( noframes == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because we replace it entering the loop anyway.*/
        DEBUG_LOG_REENTER_WITH_NODE(node);
        noframes = memory.original_node;
        state = memory.reentry_state;
        body_seen = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(noframes);
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            doc->badAccess |=  BA_USING_NOFRAMES;
        }
    }

    mode = IgnoreWhitespace;

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)(doc, mode);
            DEBUG_LOG_GOT_TOKEN(node);
        }
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->tag == noframes->tag && node->type == EndTag )
                {
                    TY_(FreeNode)( doc, node);
                    noframes->closed = yes;
                    TrimSpaces(doc, noframes);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsFRAME(node) || nodeIsFRAMESET(node) )
                {
                    TrimSpaces(doc, noframes);
                    if (node->type == EndTag)
                    {
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);       /* Throw it away */
                    }
                    else
                    {
                        TY_(Report)(doc, noframes, node, MISSING_ENDTAG_BEFORE);
                        TY_(UngetToken)( doc );
                    }
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsHTML(node) )
                {
                    if (TY_(nodeIsElement)(node))
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(noframes, node))
                    continue;

                if ( nodeIsBODY(node) && node->type == StartTag )
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseNoFrames);
                    memory.original_node = noframes;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_NODEISBODY;
                    memory.register_1 = lexer->seenEndBody;
                    memory.mode = IgnoreWhitespace;

                    TY_(InsertNodeAtEnd)(noframes, node);
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }

                /* implicit body element inferred */
                if (TY_(nodeIsText)(node) || (node->tag && node->type != EndTag))
                {
                    Node *body = TY_(FindBody)( doc );
                    if ( body || lexer->seenEndBody )
                    {
                        if ( body == NULL )
                        {
                            TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                            TY_(FreeNode)( doc, node);
                            continue;
                        }
                        if ( TY_(nodeIsText)(node) )
                        {
                            TY_(UngetToken)( doc );
                            node = TY_(InferredTag)(doc, TidyTag_P);
                            TY_(Report)(doc, noframes, node, CONTENT_AFTER_BODY );
                        }
                        TY_(InsertNodeAtEnd)( body, node );
                    }
                    else
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        if ( cfgBool(doc, TidyXmlOut) )
                            TY_(Report)(doc, noframes, node, INSERTING_TAG);
                        TY_(InsertNodeAtEnd)( noframes, node );
                    }

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseNoFrames);
                        memory.original_node = noframes;
                        memory.reentry_node = node;
                        memory.mode = IgnoreWhitespace; /*MixedContent*/
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected end tags */
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
                
            case STATE_POST_NODEISBODY:
            {
                /* fix for bug http://tidy.sf.net/bug/887259 */
                if (body_seen && TY_(FindBody)(doc) != node)
                {
                    TY_(CoerceNode)(doc, node, TidyTag_DIV, no, no);
                    MoveNodeToBody(doc, node);
                }
                state = STATE_INITIAL;
                continue;

            } break;
                
                
            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, noframes, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}